

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O3

VisitReturn __thiscall QMakeEvaluator::visitProBlock(QMakeEvaluator *this,ushort *tokPtr)

{
  uint *puVar1;
  ProValueMapStack *this_00;
  size_t *psVar2;
  ushort tok;
  ProFile *this_01;
  Data *pDVar3;
  byte bVar4;
  VisitReturn VVar5;
  CutResult CVar6;
  char16_t *pcVar7;
  char *pcVar8;
  QArrayData *pQVar9;
  storage_type_conflict *psVar10;
  byte bVar11;
  uint uVar12;
  char *fmt;
  byte bVar13;
  long in_FS_OFFSET;
  bool bVar14;
  QStringView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QStringView config;
  QString local_b0;
  ProKey local_98;
  QArrayDataPointer<ProString> local_68;
  uint *local_48;
  storage_type_conflict *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_debugLevel != 0) {
    traceMsgInternal(this,"entering block");
  }
  local_68.d = (Data *)0x0;
  local_68.ptr = (ProString *)0x0;
  local_68.size = 0;
  this_01 = (this->m_current).pro;
  this_00 = &this->m_valuemapStack;
  bVar11 = 1;
  bVar4 = 0;
  bVar13 = 0;
LAB_0027ea3d:
  local_48 = (uint *)((long)tokPtr + 2);
  tok = (ushort)*(uint *)tokPtr;
  VVar5 = ReturnBreak;
  pcVar8 = "break";
  switch(tok) {
  case 0:
    if (this->m_debugLevel != 0) {
      pcVar8 = "false";
      if (bVar11 != 0) {
        pcVar8 = "true";
      }
      traceMsgInternal(this,"leaving block, okey=%s",pcVar8);
    }
    VVar5 = (VisitReturn)bVar11;
    goto LAB_0027f606;
  case 1:
    (this->m_current).line = *(ushort *)((long)tokPtr + 2);
    tokPtr = (ushort *)((long)tokPtr + 4);
    goto LAB_0027ea3d;
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
    VVar5 = visitProVariable(this,tok,(ProStringList *)&local_68,(ushort **)&local_48);
    if (VVar5 == ReturnError) {
      VVar5 = ReturnError;
      goto LAB_0027f5b4;
    }
    QList<ProString>::clear((QList<ProString> *)&local_68);
    tokPtr = (ushort *)local_48;
    goto LAB_0027ea3d;
  default:
    local_48 = (uint *)tokPtr;
    VVar5 = evaluateExpression(this,(ushort **)&local_48,(ProStringList *)&local_68,false);
    if ((VVar5 == ReturnError) ||
       (bVar14 = local_48 != (uint *)tokPtr, tokPtr = (ushort *)local_48, bVar14))
    goto LAB_0027f482;
    goto LAB_0027ea3d;
  case 0x10:
    if (bVar13 == bVar11) {
      if (this->m_debugLevel != 0) {
        if (local_68.size == 1) {
          formatValue(&local_b0,local_68.ptr,true);
          QString::toLocal8Bit_helper((QChar *)&local_98,(longlong)local_b0.d.ptr);
          pQVar9 = (QArrayData *)local_98.super_ProString.m_string.d.ptr;
          if ((QArrayData *)local_98.super_ProString.m_string.d.ptr == (QArrayData *)0x0) {
            pQVar9 = (QArrayData *)&QByteArray::_empty;
          }
          pcVar8 = "skipped condition %s";
          goto LAB_0027ed78;
        }
        pcVar8 = "skipped condition %s";
LAB_0027f4a7:
        traceMsgInternal(this,pcVar8,"<invalid>");
      }
    }
    else {
      if (local_68.size == 1) {
        pcVar7 = ((local_68.ptr)->m_string).d.ptr;
        local_98.super_ProString.m_string.d.d = (Data *)(long)(local_68.ptr)->m_offset;
        local_b0.d.d = (Data *)(long)(local_68.ptr)->m_length;
        CVar6 = QtPrivate::QContainerImplHelper::mid
                          (((local_68.ptr)->m_string).d.size,(qsizetype *)&local_98,
                           (qsizetype *)&local_b0);
        if (CVar6 == Null) {
          pQVar9 = (QArrayData *)0x0;
          psVar10 = (storage_type_conflict *)0x0;
        }
        else {
          psVar10 = pcVar7 + (long)local_98.super_ProString.m_string.d.d;
          pQVar9 = &(local_b0.d.d)->super_QArrayData;
        }
        config.m_data = psVar10;
        config.m_size = (qsizetype)pQVar9;
        bVar14 = isActiveConfig(this,config,true);
        if (this->m_debugLevel != 0) {
          formatValue(&local_b0,local_68.ptr,true);
          QString::toLocal8Bit_helper((QChar *)&local_98,(longlong)local_b0.d.ptr);
          pQVar9 = (QArrayData *)local_98.super_ProString.m_string.d.ptr;
          if ((QArrayData *)local_98.super_ProString.m_string.d.ptr == (QArrayData *)0x0) {
            pQVar9 = (QArrayData *)&QByteArray::_empty;
          }
          traceMsgInternal(this,"condition %s is %s",pQVar9);
          if (&(local_98.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate
                        (&(local_98.super_ProString.m_string.d.d)->super_QArrayData,1,0x10);
            }
          }
          if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        goto LAB_0027f581;
      }
      QVar17.m_data = (storage_type *)0x2c;
      QVar17.m_size = (qsizetype)&local_98;
      QString::fromLatin1(QVar17);
      message(this,0x310,(QString *)&local_98);
      pDVar3 = local_98.super_ProString.m_string.d.d;
      if (&(local_98.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
LAB_0027f2dd:
      bVar11 = 0;
    }
    goto LAB_0027f58a;
  case 0x11:
    if (bVar13 == bVar11) {
      skipExpression(this,(ushort **)&local_48);
      if (this->m_debugLevel != 0) {
        if (local_68.size != 1) {
          pcVar8 = "skipped test function %s";
          goto LAB_0027f4a7;
        }
        formatValue(&local_b0,local_68.ptr,true);
        QString::toLocal8Bit_helper((QChar *)&local_98,(longlong)local_b0.d.ptr);
        pQVar9 = (QArrayData *)local_98.super_ProString.m_string.d.ptr;
        if ((QArrayData *)local_98.super_ProString.m_string.d.ptr == (QArrayData *)0x0) {
          pQVar9 = (QArrayData *)&QByteArray::_empty;
        }
        pcVar8 = "skipped test function %s";
LAB_0027ed78:
        traceMsgInternal(this,pcVar8,pQVar9);
        pDVar3 = local_98.super_ProString.m_string.d.d;
        if (&(local_98.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate
                      (&(local_98.super_ProString.m_string.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    else {
      if (local_68.size != 1) {
        QVar16.m_data = (storage_type *)0x2a;
        QVar16.m_size = (qsizetype)&local_98;
        QString::fromLatin1(QVar16);
        message(this,0x310,(QString *)&local_98);
        pDVar3 = local_98.super_ProString.m_string.d.d;
        if (&(local_98.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate
                      (&(local_98.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        skipExpression(this,(ushort **)&local_48);
        goto LAB_0027f2dd;
      }
      if (this->m_debugLevel != 0) {
        formatValue(&local_b0,local_68.ptr,true);
        QString::toLocal8Bit_helper((QChar *)&local_98,(longlong)local_b0.d.ptr);
        pQVar9 = (QArrayData *)local_98.super_ProString.m_string.d.ptr;
        if ((QArrayData *)local_98.super_ProString.m_string.d.ptr == (QArrayData *)0x0) {
          pQVar9 = (QArrayData *)&QByteArray::_empty;
        }
        traceMsgInternal(this,"evaluating test function %s",pQVar9);
        pDVar3 = local_98.super_ProString.m_string.d.d;
        if (&(local_98.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate
                      (&(local_98.super_ProString.m_string.d.d)->super_QArrayData,1,0x10);
          }
        }
        if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      VVar5 = evaluateConditionalFunction(this,(ProKey *)local_68.ptr,(ushort **)&local_48);
      bVar14 = true;
      if (VVar5 != ReturnTrue) {
        if (VVar5 != ReturnFalse) {
          if (this->m_debugLevel == 0) goto LAB_0027f606;
          if (VVar5 - ReturnError < 3) {
            pcVar8 = (&PTR_anon_var_dwarf_753b8e_002e3e60)[VVar5 - ReturnError];
          }
          else {
            pcVar8 = "<invalid>";
            if (VVar5 == ReturnReturn) {
              pcVar8 = "return";
            }
          }
          fmt = "aborting block, function status: %s";
          goto LAB_0027f5fc;
        }
        bVar14 = false;
      }
      if (this->m_debugLevel != 0) {
        pcVar8 = "false";
        if (bVar14 != false) {
          pcVar8 = "true";
        }
        traceMsgInternal(this,"test function returned %s",pcVar8);
      }
LAB_0027f581:
      bVar11 = bVar14 ^ bVar4;
    }
LAB_0027f58a:
    bVar13 = bVar11 ^ 1;
    QList<ProString>::clear((QList<ProString> *)&local_68);
    bVar4 = 0;
    tokPtr = (ushort *)local_48;
    goto LAB_0027ea3d;
  case 0x12:
    QArrayDataPointer<ProString>::operator=
              ((QArrayDataPointer<ProString> *)&this->m_returnValue,&local_68);
    QList<ProString>::clear((QList<ProString> *)&local_68);
    VVar5 = ReturnReturn;
    pcVar8 = "return";
    break;
  case 0x13:
    break;
  case 0x14:
    VVar5 = ReturnNext;
    pcVar8 = "next";
    break;
  case 0x15:
    if (this->m_debugLevel != 0) {
      traceMsgInternal(this,"NOT","break");
    }
    bVar4 = bVar4 ^ 1;
    tokPtr = (ushort *)local_48;
    goto LAB_0027ea3d;
  case 0x16:
    if (this->m_debugLevel == 0) goto LAB_0027f226;
    bVar13 = 0;
    pcVar8 = "AND";
    goto LAB_0027ef7b;
  case 0x17:
    bVar13 = 1;
    tokPtr = (ushort *)local_48;
    if (this->m_debugLevel != 0) {
      pcVar8 = "OR";
LAB_0027ef7b:
      traceMsgInternal(this,pcVar8,"break");
      tokPtr = (ushort *)local_48;
    }
    goto LAB_0027ea3d;
  case 0x18:
    local_48 = (uint *)((long)tokPtr + 6);
    uVar12 = *(uint *)((long)tokPtr + 2);
    VVar5 = 0xaaaaaaaa;
    if (bVar11 != 0) {
      if (this->m_debugLevel != 0) {
        traceMsgInternal(this,"taking \'then\' branch","break");
      }
      if (uVar12 == 0) {
        VVar5 = ReturnTrue;
      }
      else {
        VVar5 = visitProBlock(this,(ushort *)local_48);
      }
      if (this->m_debugLevel != 0) {
        traceMsgInternal(this,"finished \'then\' branch");
      }
    }
    puVar1 = (uint *)((long)local_48 + (ulong)uVar12 * 2);
    local_48 = puVar1 + 1;
    uVar12 = *puVar1;
    if (bVar11 == 0) {
      if (this->m_debugLevel != 0) {
        traceMsgInternal(this,"taking \'else\' branch");
      }
      if (uVar12 == 0) {
        VVar5 = ReturnTrue;
      }
      else {
        VVar5 = visitProBlock(this,(ushort *)local_48);
      }
      if (this->m_debugLevel != 0) {
        pcVar8 = "finished \'else\' branch";
LAB_0027f381:
        traceMsgInternal(this,pcVar8);
      }
    }
    goto LAB_0027f471;
  case 0x19:
    if (bVar11 == bVar13) {
      local_48 = (uint *)((long)tokPtr +
                         (ulong)*(uint *)((long)tokPtr +
                                         (ulong)*(ushort *)((long)tokPtr + 6) * 2 + 8) * 2 +
                         (ulong)*(ushort *)((long)tokPtr + 6) * 2 + 0x10);
      uVar12 = local_48[-1];
      VVar5 = ReturnTrue;
      if (this->m_debugLevel != 0) {
        traceMsgInternal(this,"skipped loop","break");
      }
    }
    else {
      ProFile::getHashStr(&local_98,this_01,(ushort **)&local_48);
      puVar1 = local_48 + 1;
      uVar12 = *(uint *)((long)local_48 + (ulong)*local_48 * 2 + 4);
      local_48 = (uint *)((long)local_48 + (ulong)*local_48 * 2 + 8);
      VVar5 = visitProLoop(this,&local_98,(ushort *)puVar1,(ushort *)local_48);
      pDVar3 = local_98.super_ProString.m_string.d.d;
      if (&(local_98.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    goto LAB_0027f471;
  case 0x1a:
  case 0x1b:
    if (bVar11 == bVar13) {
      if (this->m_debugLevel != 0) {
        traceMsgInternal(this,"skipped function definition","break");
      }
      uVar12 = *(uint *)((long)local_48 + (ulong)(ushort)local_48[1] * 2 + 6);
      local_48 = (uint *)((long)local_48 + (ulong)(ushort)local_48[1] * 2 + 10);
    }
    else {
      ProFile::getHashStr(&local_98,this_01,(ushort **)&local_48);
      uVar12 = *local_48;
      local_48 = local_48 + 1;
      visitProFunctionDef(this,tok,&local_98,(ushort *)local_48);
      if (this->m_debugLevel != 0) {
        pcVar8 = "replace";
        if (tok == 0x1a) {
          pcVar8 = "test";
        }
        local_b0.d.d = (Data *)(long)local_98.super_ProString.m_offset;
        local_40 = (storage_type_conflict *)(long)local_98.super_ProString.m_length;
        CVar6 = QtPrivate::QContainerImplHelper::mid
                          (local_98.super_ProString.m_string.d.size,(qsizetype *)&local_b0,
                           (qsizetype *)&local_40);
        psVar10 = local_40;
        if (CVar6 == Null) {
          psVar10 = (storage_type_conflict *)0x0;
        }
        QVar15.m_data = psVar10;
        QVar15.m_size = (qsizetype)&local_b0;
        QtPrivate::convertToLocal8Bit(QVar15);
        pcVar7 = local_b0.d.ptr;
        if (local_b0.d.ptr == (char16_t *)0x0) {
          pcVar7 = (char16_t *)&QByteArray::_empty;
        }
        traceMsgInternal(this,"defined %s function %s",pcVar8,pcVar7);
        if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
      pDVar3 = local_98.super_ProString.m_string.d.d;
      if (&(local_98.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i =
             ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    local_48 = (uint *)((long)local_48 + (ulong)uVar12 * 2);
    bVar11 = 1;
LAB_0027f226:
    bVar13 = 0;
    tokPtr = (ushort *)local_48;
    goto LAB_0027ea3d;
  case 0x1c:
    local_48 = (uint *)((long)tokPtr + 6);
    uVar12 = *(uint *)((long)tokPtr + 2);
    if ((bVar11 == bVar13) || (uVar12 == 0)) {
      VVar5 = ReturnTrue;
      if (this->m_debugLevel != 0) {
        pcVar8 = "skipped nesting-bypassing block";
        goto LAB_0027f381;
      }
    }
    else {
      local_98.super_ProString.m_string.d.d =
           (Data *)(this->m_valuemapStack).
                   super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                   .
                   super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next;
      local_98.super_ProString.m_string.d.ptr =
           (char16_t *)
           (this->m_valuemapStack).
           super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
           super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
      local_98.super_ProString.m_string.d.size =
           (this->m_valuemapStack).
           super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
           super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
           ._M_impl._M_node._M_size;
      if ((ProValueMapStack *)local_98.super_ProString.m_string.d.d == this_00) {
        local_98.super_ProString.m_string.d.d = (Data *)&local_98;
        local_98.super_ProString.m_string.d.ptr = (char16_t *)local_98.super_ProString.m_string.d.d;
      }
      else {
        *(_List_node_base **)local_98.super_ProString.m_string.d.ptr = (_List_node_base *)&local_98;
        ((QArrayData *)local_98.super_ProString.m_string.d.d)->alloc = (qsizetype)&local_98;
        (this->m_valuemapStack).
        super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
        super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
        ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
        (this->m_valuemapStack).
        super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
        super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
        (this->m_valuemapStack).
        super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
        super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
        ._M_impl._M_node._M_size = 0;
      }
      std::__cxx11::
      _List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::
      _M_clear((_List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                *)this_00);
      (this->m_valuemapStack).
      super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
      super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
      (this->m_valuemapStack).
      super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
      super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
      (this->m_valuemapStack).
      super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
      super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
      _M_impl._M_node._M_size = 0;
      if ((ProValueMapStack *)*(undefined1 **)local_98.super_ProString.m_string.d.d != this_00 &&
          this_00 != (ProValueMapStack *)local_98.super_ProString.m_string.d.d) {
        std::__detail::_List_node_base::_M_transfer
                  ((_List_node_base *)this_00,
                   (_List_node_base *)local_98.super_ProString.m_string.d.d);
        psVar2 = &(this->m_valuemapStack).
                  super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                  .
                  super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                  ._M_impl._M_node._M_size;
        *psVar2 = *psVar2 + 1;
        local_98.super_ProString.m_string.d.size = local_98.super_ProString.m_string.d.size - 1;
      }
      if (this->m_debugLevel != 0) {
        traceMsgInternal(this,"visiting nesting-bypassing block");
      }
      VVar5 = visitProBlock(this,(ushort *)local_48);
      if (this->m_debugLevel != 0) {
        traceMsgInternal(this,"visited nesting-bypassing block");
      }
      pQVar9 = (QArrayData *)
               (this_00->
               super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
               ).
               super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      if (*(QArrayData **)pQVar9 != &(local_98.super_ProString.m_string.d.d)->super_QArrayData &&
          &(local_98.super_ProString.m_string.d.d)->super_QArrayData != pQVar9) {
        std::__detail::_List_node_base::_M_transfer
                  ((_List_node_base *)local_98.super_ProString.m_string.d.d,
                   (_List_node_base *)pQVar9);
        local_98.super_ProString.m_string.d.size = local_98.super_ProString.m_string.d.size + 1;
        psVar2 = &(this->m_valuemapStack).
                  super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                  .
                  super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                  ._M_impl._M_node._M_size;
        *psVar2 = *psVar2 - 1;
      }
      std::__cxx11::list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
      ::_M_move_assign(&this_00->
                        super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                       ,&local_98);
      std::__cxx11::
      _List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::
      _M_clear((_List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                *)&local_98);
    }
LAB_0027f471:
    local_48 = (uint *)((long)local_48 + (ulong)uVar12 * 2);
    bVar11 = 1;
    bVar13 = 0;
LAB_0027f482:
    tokPtr = (ushort *)local_48;
    if (ReturnTrue < VVar5) {
LAB_0027f5b4:
      if (this->m_debugLevel != 0) {
        if (VVar5 - ReturnError < 3) {
          pcVar8 = (&PTR_anon_var_dwarf_753b8e_002e3e60)[VVar5 - ReturnError];
        }
        else {
          pcVar8 = "<invalid>";
          if (VVar5 == ReturnReturn) {
            pcVar8 = "return";
          }
        }
        fmt = "aborting block, status: %s";
LAB_0027f5fc:
        traceMsgInternal(this,fmt,pcVar8);
      }
LAB_0027f606:
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_68);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return VVar5;
      }
      __stack_chk_fail();
    }
    goto LAB_0027ea3d;
  }
  if (bVar11 != bVar13) {
    if (this->m_debugLevel == 0) goto LAB_0027f606;
    fmt = "flow control statement \'%s\', aborting block";
    goto LAB_0027f5fc;
  }
  bVar13 = 1;
  bVar11 = 0;
  tokPtr = (ushort *)local_48;
  if (this->m_debugLevel != 0) {
    traceMsgInternal(this,"skipped flow control statement \'%s\'",pcVar8);
    tokPtr = (ushort *)local_48;
  }
  goto LAB_0027ea3d;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::visitProBlock(
        const ushort *tokPtr)
{
    traceMsg("entering block");
    ProStringList curr;
    ProFile *pro = m_current.pro;
    bool okey = true, or_op = false, invert = false;
    uint blockLen;
    while (ushort tok = *tokPtr++) {
        VisitReturn ret;
        switch (tok) {
        case TokLine:
            m_current.line = *tokPtr++;
            continue;
        case TokAssign:
        case TokAppend:
        case TokAppendUnique:
        case TokRemove:
        case TokReplace:
            ret = visitProVariable(tok, curr, tokPtr);
            if (ret == ReturnError)
                break;
            curr.clear();
            continue;
        case TokBranch:
            blockLen = getBlockLen(tokPtr);
            if (m_cumulative) {
#ifdef PROEVALUATOR_CUMULATIVE
                if (!okey)
                    m_skipLevel++;
                ret = blockLen ? visitProBlock(tokPtr) : ReturnTrue;
                tokPtr += blockLen;
                blockLen = getBlockLen(tokPtr);
                if (!okey)
                    m_skipLevel--;
                else
                    m_skipLevel++;
                if ((ret == ReturnTrue || ret == ReturnFalse) && blockLen)
                    ret = visitProBlock(tokPtr);
                if (okey)
                    m_skipLevel--;
#endif
            } else {
                if (okey) {
                    traceMsg("taking 'then' branch");
                    ret = blockLen ? visitProBlock(tokPtr) : ReturnTrue;
                    traceMsg("finished 'then' branch");
                }
                tokPtr += blockLen;
                blockLen = getBlockLen(tokPtr);
                if (!okey) {
                    traceMsg("taking 'else' branch");
                    ret = blockLen ? visitProBlock(tokPtr) : ReturnTrue;
                    traceMsg("finished 'else' branch");
                }
            }
            tokPtr += blockLen;
            okey = true, or_op = false; // force next evaluation
            break;
        case TokForLoop:
            if (m_cumulative || okey != or_op) {
                const ProKey &variable = pro->getHashStr(tokPtr);
                uint exprLen = getBlockLen(tokPtr);
                const ushort *exprPtr = tokPtr;
                tokPtr += exprLen;
                blockLen = getBlockLen(tokPtr);
                ret = visitProLoop(variable, exprPtr, tokPtr);
            } else {
                skipHashStr(tokPtr);
                uint exprLen = getBlockLen(tokPtr);
                tokPtr += exprLen;
                blockLen = getBlockLen(tokPtr);
                traceMsg("skipped loop");
                ret = ReturnTrue;
            }
            tokPtr += blockLen;
            okey = true, or_op = false; // force next evaluation
            break;
        case TokBypassNesting:
            blockLen = getBlockLen(tokPtr);
            if ((m_cumulative || okey != or_op) && blockLen) {
                ProValueMapStack savedValuemapStack = std::move(m_valuemapStack);
                m_valuemapStack.clear();
                m_valuemapStack.splice(m_valuemapStack.end(),
                                       savedValuemapStack, savedValuemapStack.begin());
                traceMsg("visiting nesting-bypassing block");
                ret = visitProBlock(tokPtr);
                traceMsg("visited nesting-bypassing block");
                savedValuemapStack.splice(savedValuemapStack.begin(),
                                          m_valuemapStack, m_valuemapStack.begin());
                m_valuemapStack = std::move(savedValuemapStack);
            } else {
                traceMsg("skipped nesting-bypassing block");
                ret = ReturnTrue;
            }
            tokPtr += blockLen;
            okey = true, or_op = false; // force next evaluation
            break;
        case TokTestDef:
        case TokReplaceDef:
            if (m_cumulative || okey != or_op) {
                const ProKey &name = pro->getHashStr(tokPtr);
                blockLen = getBlockLen(tokPtr);
                visitProFunctionDef(tok, name, tokPtr);
                traceMsg("defined %s function %s",
                      tok == TokTestDef ? "test" : "replace", dbgKey(name));
            } else {
                traceMsg("skipped function definition");
                skipHashStr(tokPtr);
                blockLen = getBlockLen(tokPtr);
            }
            tokPtr += blockLen;
            okey = true, or_op = false; // force next evaluation
            continue;
        case TokNot:
            traceMsg("NOT");
            invert ^= true;
            continue;
        case TokAnd:
            traceMsg("AND");
            or_op = false;
            continue;
        case TokOr:
            traceMsg("OR");
            or_op = true;
            continue;
        case TokCondition:
            if (!m_skipLevel && okey != or_op) {
                if (curr.size() != 1) {
                    if (!m_cumulative || !curr.isEmpty())
                        evalError(fL1S("Conditional must expand to exactly one word."));
                    okey = false;
                } else {
                    okey = isActiveConfig(curr.at(0).toQStringView(), true);
                    traceMsg("condition %s is %s", dbgStr(curr.at(0)), dbgBool(okey));
                    okey ^= invert;
                }
            } else {
                traceMsg("skipped condition %s", curr.size() == 1 ? dbgStr(curr.at(0)) : "<invalid>");
            }
            or_op = !okey; // tentatively force next evaluation
            invert = false;
            curr.clear();
            continue;
        case TokTestCall:
            if (!m_skipLevel && okey != or_op) {
                if (curr.size() != 1) {
                    if (!m_cumulative || !curr.isEmpty())
                        evalError(fL1S("Test name must expand to exactly one word."));
                    skipExpression(tokPtr);
                    okey = false;
                } else {
                    traceMsg("evaluating test function %s", dbgStr(curr.at(0)));
                    ret = evaluateConditionalFunction(curr.at(0).toKey(), tokPtr);
                    switch (ret) {
                    case ReturnTrue: okey = true; break;
                    case ReturnFalse: okey = false; break;
                    default:
                        traceMsg("aborting block, function status: %s", dbgReturn(ret));
                        return ret;
                    }
                    traceMsg("test function returned %s", dbgBool(okey));
                    okey ^= invert;
                }
            } else if (m_cumulative) {
#ifdef PROEVALUATOR_CUMULATIVE
                m_skipLevel++;
                if (curr.size() != 1)
                    skipExpression(tokPtr);
                else
                    evaluateConditionalFunction(curr.at(0).toKey(), tokPtr);
                m_skipLevel--;
#endif
            } else {
                skipExpression(tokPtr);
                traceMsg("skipped test function %s", curr.size() == 1 ? dbgStr(curr.at(0)) : "<invalid>");
            }
            or_op = !okey; // tentatively force next evaluation
            invert = false;
            curr.clear();
            continue;
        case TokReturn:
            m_returnValue = curr;
            curr.clear();
            ret = ReturnReturn;
            goto ctrlstm;
        case TokBreak:
            ret = ReturnBreak;
            goto ctrlstm;
        case TokNext:
            ret = ReturnNext;
          ctrlstm:
            if (!m_skipLevel && okey != or_op) {
                traceMsg("flow control statement '%s', aborting block", dbgReturn(ret));
                return ret;
            }
            traceMsg("skipped flow control statement '%s'", dbgReturn(ret));
            okey = false, or_op = true; // force next evaluation
            continue;
        default: {
                const ushort *oTokPtr = --tokPtr;
                ret = evaluateExpression(tokPtr, &curr, false);
                if (ret == ReturnError || tokPtr != oTokPtr)
                    break;
            }
            Q_ASSERT_X(false, "visitProBlock", "unexpected item type");
            continue;
        }
        if (ret != ReturnTrue && ret != ReturnFalse) {
            traceMsg("aborting block, status: %s", dbgReturn(ret));
            return ret;
        }
    }
    traceMsg("leaving block, okey=%s", dbgBool(okey));
    return returnBool(okey);
}